

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void line_stop(t_line_conflict *x)

{
  double dVar1;
  double dVar2;
  t_line_conflict *x_local;
  
  if (0x2f < pd_compatibilitylevel) {
    dVar1 = clock_getsystime();
    if (dVar1 < x->x_targettime) {
      dVar1 = x->x_1overtimediff;
      dVar2 = clock_getsystime();
      x->x_setval = (float)(dVar1 * (dVar2 - x->x_prevtime) * (double)(x->x_targetval - x->x_setval)
                           + (double)x->x_setval);
    }
    else {
      x->x_setval = x->x_targetval;
    }
  }
  x->x_targetval = x->x_setval;
  clock_unset(x->x_clock);
  return;
}

Assistant:

static void line_stop(t_line *x)
{
    if (pd_compatibilitylevel >= 48)
    {
        if (clock_getsystime() >= x->x_targettime)
            x->x_setval = x->x_targetval;
        else x->x_setval += x->x_1overtimediff *
            (clock_getsystime() - x->x_prevtime) *
                (x->x_targetval - x->x_setval);
    }
    x->x_targetval = x->x_setval;
    clock_unset(x->x_clock);
}